

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# discrete_fourier_transform.cc
# Opt level: O0

bool __thiscall
sptk::DiscreteFourierTransform::Run
          (DiscreteFourierTransform *this,vector<double,_std::allocator<double>_> *real_part_input,
          vector<double,_std::allocator<double>_> *imag_part_input,
          vector<double,_std::allocator<double>_> *real_part_output,
          vector<double,_std::allocator<double>_> *imag_part_output)

{
  double dVar1;
  double dVar2;
  double dVar3;
  size_type sVar4;
  const_reference pvVar5;
  const_reference pvVar6;
  reference pvVar7;
  reference pvVar8;
  const_reference pvVar9;
  vector<double,_std::allocator<double>_> *in_RCX;
  int iVar10;
  vector<double,_std::allocator<double>_> *in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  long in_RDI;
  vector<double,_std::allocator<double>_> *in_R8;
  int index;
  int n;
  double sum_y;
  double sum_x;
  int k;
  double *output_y;
  double *output_x;
  double *input_y;
  double *input_x;
  size_type in_stack_ffffffffffffff78;
  value_type vVar11;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff80;
  value_type vVar12;
  int local_6c;
  double local_68;
  double local_60;
  int local_54;
  
  if (((((*(byte *)(in_RDI + 0xc) & 1) != 0) &&
       (sVar4 = std::vector<double,_std::allocator<double>_>::size(in_RSI),
       sVar4 == (long)*(int *)(in_RDI + 8))) &&
      (sVar4 = std::vector<double,_std::allocator<double>_>::size(in_RDX),
      sVar4 == (long)*(int *)(in_RDI + 8))) &&
     ((in_RCX != (vector<double,_std::allocator<double>_> *)0x0 &&
      (in_R8 != (vector<double,_std::allocator<double>_> *)0x0)))) {
    sVar4 = std::vector<double,_std::allocator<double>_>::size(in_RCX);
    if (sVar4 != (long)*(int *)(in_RDI + 8)) {
      std::vector<double,_std::allocator<double>_>::resize
                (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    }
    sVar4 = std::vector<double,_std::allocator<double>_>::size(in_R8);
    if (sVar4 != (long)*(int *)(in_RDI + 8)) {
      std::vector<double,_std::allocator<double>_>::resize
                (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    }
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,0);
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](in_RDX,0);
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](in_RCX,0);
    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](in_R8,0);
    for (local_54 = 0; local_54 < *(int *)(in_RDI + 8); local_54 = local_54 + 1) {
      local_60 = 0.0;
      local_68 = 0.0;
      for (local_6c = 0; local_6c < *(int *)(in_RDI + 8); local_6c = local_6c + 1) {
        iVar10 = (local_54 * local_6c) % *(int *)(in_RDI + 8);
        dVar1 = pvVar5[local_6c];
        pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x28),(long)iVar10)
        ;
        dVar2 = *pvVar9;
        dVar3 = pvVar6[local_6c];
        pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x10),(long)iVar10)
        ;
        local_60 = dVar1 * dVar2 + -(dVar3 * *pvVar9) + local_60;
        vVar11 = pvVar5[local_6c];
        pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x10),(long)iVar10)
        ;
        vVar12 = *pvVar9;
        dVar1 = pvVar6[local_6c];
        pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x28),(long)iVar10)
        ;
        local_68 = vVar11 * vVar12 + dVar1 * *pvVar9 + local_68;
      }
      pvVar7[local_54] = local_60;
      pvVar8[local_54] = local_68;
    }
    return true;
  }
  return false;
}

Assistant:

bool DiscreteFourierTransform::Run(
    const std::vector<double>& real_part_input,
    const std::vector<double>& imag_part_input,
    std::vector<double>* real_part_output,
    std::vector<double>* imag_part_output) const {
  // Check inputs
  if (!is_valid_ ||
      real_part_input.size() != static_cast<std::size_t>(dft_length_) ||
      imag_part_input.size() != static_cast<std::size_t>(dft_length_) ||
      NULL == real_part_output || NULL == imag_part_output) {
    return false;
  }

  // Prepare memories.
  if (real_part_output->size() != static_cast<std::size_t>(dft_length_)) {
    real_part_output->resize(dft_length_);
  }
  if (imag_part_output->size() != static_cast<std::size_t>(dft_length_)) {
    imag_part_output->resize(dft_length_);
  }

  const double* input_x(&(real_part_input[0]));
  const double* input_y(&(imag_part_input[0]));
  double* output_x(&((*real_part_output)[0]));
  double* output_y(&((*imag_part_output)[0]));

  for (int k(0); k < dft_length_; ++k) {
    double sum_x(0.0);
    double sum_y(0.0);
    for (int n(0); n < dft_length_; ++n) {
      const int index(k * n % dft_length_);
      sum_x +=
          input_x[n] * cosine_table_[index] - input_y[n] * sine_table_[index];
      sum_y +=
          input_x[n] * sine_table_[index] + input_y[n] * cosine_table_[index];
    }
    output_x[k] = sum_x;
    output_y[k] = sum_y;
  }

  return true;
}